

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

missing_events * __thiscall
clipp::parser::missed(missing_events *__return_storage_ptr__,parser *this)

{
  bool bVar1;
  size_type __n;
  pointer pmVar2;
  child *this_00;
  parameter *local_48;
  __normal_iterator<const_clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
  local_40;
  __normal_iterator<const_clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
  local_38;
  const_iterator i;
  parser *this_local;
  missing_events *misses;
  
  std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::vector
            (__return_storage_ptr__);
  __n = std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
        size(&this->missCand_);
  std::vector<clipp::parser::missing_event,_std::allocator<clipp::parser::missing_event>_>::reserve
            (__return_storage_ptr__,__n);
  local_38._M_current =
       (miss_candidate *)
       std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>::
       begin(&this->missCand_);
  while( true ) {
    local_40._M_current =
         (miss_candidate *)
         std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
         ::end(&this->missCand_);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    pmVar2 = __gnu_cxx::
             __normal_iterator<const_clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
             ::operator->(&local_38);
    this_00 = group::depth_first_traverser::operator->(&pmVar2->pos);
    local_48 = group::child_t<clipp::parameter,_clipp::group>::as_param(this_00);
    pmVar2 = __gnu_cxx::
             __normal_iterator<const_clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
             ::operator->(&local_38);
    std::vector<clipp::parser::missing_event,std::allocator<clipp::parser::missing_event>>::
    emplace_back<clipp::parameter_const*,int_const&>
              ((vector<clipp::parser::missing_event,std::allocator<clipp::parser::missing_event>> *)
               __return_storage_ptr__,&local_48,&pmVar2->index);
    __gnu_cxx::
    __normal_iterator<const_clipp::parser::miss_candidate_*,_std::vector<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>_>
    ::operator++(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

missing_events missed() const {
        missing_events misses;
        misses.reserve(missCand_.size());
        for(auto i = missCand_.begin(); i != missCand_.end(); ++i) {
            misses.emplace_back(&(i->pos->as_param()), i->index);
        }
        return misses;
    }